

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O3

int sm2_bn_asn1_encode(uint8_t *asn1,int *make,uint8_t *bn)

{
  int iVar1;
  size_t __n;
  uint uVar2;
  long lVar3;
  byte bVar4;
  uint8_t *__dest;
  int iVar5;
  
  iVar1 = 0;
  if (bn != (uint8_t *)0x0 && (make != (int *)0x0 && asn1 != (uint8_t *)0x0)) {
    bVar4 = *bn;
    iVar1 = 0;
    lVar3 = 0;
    if (bVar4 == 0) {
      do {
        bVar4 = bn[lVar3 + 1];
        lVar3 = lVar3 + 1;
      } while (bVar4 == 0);
      bn = bn + lVar3;
    }
    iVar5 = (uint)(bVar4 >> 7) - (int)lVar3;
    uVar2 = iVar5 + 0x20;
    if (-1 < (int)uVar2) {
      *asn1 = '\x02';
      asn1[1] = (uint8_t)uVar2;
      if ((char)*bn < '\0') {
        asn1[2] = '\0';
        __dest = asn1 + 3;
        __n = (size_t)(iVar5 + 0x1f);
      }
      else {
        __dest = asn1 + 2;
        __n = (size_t)uVar2;
      }
      memcpy(__dest,bn,__n);
      *make = iVar5 + 0x22;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int sm2_bn_asn1_encode(uint8_t asn1[35], int *make, uint8_t bn[32])
{
    int ret = GML_ERROR;
    int zeros = 0;
    int len;

    if (asn1 == NULL || make == NULL || bn == NULL)
        goto end;

    while (*bn == 0) {
        zeros++;
        bn++;
    }

    len = 0x20 - zeros + (int)(bn[0] >= 0x80U); // bn is considered as negative if bn[0] >= 0x80
    if (len < 0)
        goto end;

    asn1[0] = 0x02U;
    asn1[1] = (uint8_t)len;
    asn1 += 2;
    if (bn[0] >= 0x80U) {
        *asn1 = 0x00U;
        asn1++;
        memcpy(asn1, bn, len - 1); // asn1 = 02 ?? bn
    }
    else {
        memcpy(asn1, bn, len); // asn1 = 02 ?? bn
    }
    *make = (len + 2);

    ret = GML_OK;
end:
    return ret;
}